

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O1

int Abc_CommandBlast(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Wlc_Ntk_t *p;
  int iVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  Gia_Man_t *pGVar6;
  FILE *__stream;
  Vec_Ptr_t *pVVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  Wlc_BstPar_t Par;
  int CountM;
  int CountA;
  Wlc_BstPar_t local_98;
  ulong local_50;
  uint local_48;
  uint local_44;
  Abc_Frame_t *local_40;
  Wlc_Ntk_t *local_38;
  
  local_38 = (Wlc_Ntk_t *)pAbc->pAbcWlc;
  local_98.fAddOutputs = 0;
  local_98.fMulti = 0;
  local_98.fBooth = 0;
  local_98.vBoxIds = (Vec_Int_t *)0x0;
  local_98.iOutput = 0xffffffff;
  local_98.fNonRest = 0;
  local_98.fCla = 0;
  local_98.fNoCleanup = 0;
  local_98.fCreateMiter = 0;
  local_98.fCreateWordMiter = 0;
  local_98.fDecMuxes = 0;
  local_50 = 0;
  local_98.fSaveFfNames = 0;
  local_98.fVerbose = 0;
  local_98.nAdderLimit = 0;
  local_98.nMultLimit = 0;
  local_98.fGiaSimple = 0;
  local_98.nOutputRange = 2;
  local_40 = pAbc;
  Extra_UtilGetoptReset();
  bVar2 = false;
  bVar1 = false;
LAB_00358188:
  do {
    iVar4 = Extra_UtilGetopt(argc,argv,"ORAMcombqadestnizvh");
    p = local_38;
    iVar3 = globalUtilOptind;
    if (iVar4 < 0x4f) {
      if (iVar4 != 0x41) {
        if (iVar4 == 0x4d) {
          if (argc <= globalUtilOptind) {
            pcVar8 = "Command line switch \"-M\" should be followed by an integer.\n";
            goto LAB_0035832e;
          }
          uVar5 = atoi(argv[globalUtilOptind]);
          local_98.nMultLimit = uVar5;
          goto LAB_003582d0;
        }
        if (iVar4 == -1) {
          if (local_38 == (Wlc_Ntk_t *)0x0) {
            pcVar8 = "Abc_CommandBlast(): There is no current design.\n";
            goto LAB_003585ac;
          }
          if (local_38->fAsyncRst != 0) {
            pcVar8 = "Abc_CommandBlast(): Trying to bit-blast network with asynchronous reset.\n";
            goto LAB_003585ac;
          }
          if (bVar2) {
            Wlc_NtkPrintInputInfo(local_38);
          }
          if (local_98.fMulti == 0) {
            if (local_98.nMultLimit != 0 || local_98.nAdderLimit != 0) {
              local_98.vBoxIds =
                   Wlc_NtkCollectAddMult(p,&local_98,(int *)&local_44,(int *)&local_48);
              if (local_98.vBoxIds == (Vec_Int_t *)0x0) {
                pcVar8 = "Warning:  There is no adders and multipliers that will not be blasted.\n";
                goto LAB_0035863e;
              }
              Abc_Print(1,"Warning:  %d adders and %d multipliers will not be blasted.\n",
                        (ulong)local_44,(ulong)local_48);
            }
          }
          else {
            local_98.vBoxIds = Wlc_NtkCollectMultipliers(p);
            if (local_98.vBoxIds == (Vec_Int_t *)0x0) {
              pcVar8 = "Warning:  There is no multipliers in the design.\n";
LAB_0035863e:
              Abc_Print(1,pcVar8);
            }
          }
          if ((-1 < local_98.iOutput) &&
             ((p->vPos).nSize < local_98.nOutputRange + local_98.iOutput)) {
            Abc_Print(1,"Abc_CommandBlast(): The output range [%d:%d] is incorrect.\n",
                      (ulong)(uint)local_98.iOutput,
                      (ulong)((local_98.nOutputRange + local_98.iOutput) - 1));
            return 0;
          }
          p_00 = Wlc_NtkBitBlast(p,&local_98);
          Vec_IntFreeP(&local_98.vBoxIds);
          if (p_00 != (Gia_Man_t *)0x0) {
            if (bVar1) {
              pGVar6 = Gia_ManTransformMiter(p_00);
              Gia_ManStop(p_00);
              Abc_Print(1,
                        "Bit-blasting created a traditional multi-output miter by XORing POs pair-wise.\n"
                       );
              p_00 = pGVar6;
              if ((int)local_50 != 0) {
                __stream = fopen("pio_name_map.txt","wb");
                if ((pGVar6->vNamesIn != (Vec_Ptr_t *)0x0) &&
                   (pVVar7 = pGVar6->vNamesIn, 0 < pVVar7->nSize)) {
                  uVar10 = 0;
                  do {
                    fprintf(__stream,"i%d %s\n",uVar10 & 0xffffffff,pVVar7->pArray[uVar10]);
                    uVar10 = uVar10 + 1;
                    pVVar7 = pGVar6->vNamesIn;
                  } while ((long)uVar10 < (long)pVVar7->nSize);
                }
                if ((pGVar6->vNamesOut != (Vec_Ptr_t *)0x0) &&
                   (pVVar7 = pGVar6->vNamesOut, 0 < pVVar7->nSize)) {
                  uVar10 = 0;
                  do {
                    fprintf(__stream,"o%d %s\n",uVar10 & 0xffffffff,pVVar7->pArray[uVar10]);
                    uVar10 = uVar10 + 1;
                    pVVar7 = pGVar6->vNamesOut;
                  } while ((long)uVar10 < (long)pVVar7->nSize);
                }
                fclose(__stream);
                Abc_Print(1,
                          "Finished dumping file \"pio_name_map.txt\" containing PI/PO name mapping.\n"
                         );
              }
            }
            Abc_FrameUpdateGia(local_40,p_00);
            return 0;
          }
          pcVar8 = "Abc_CommandBlast(): Bit-blasting has failed.\n";
LAB_003585ac:
          Abc_Print(1,pcVar8);
          return 0;
        }
        goto switchD_003581a9_caseD_66;
      }
      if (argc <= globalUtilOptind) {
        pcVar8 = "Command line switch \"-A\" should be followed by an integer.\n";
        goto LAB_0035832e;
      }
      uVar5 = atoi(argv[globalUtilOptind]);
      local_98.nAdderLimit = uVar5;
    }
    else {
      switch(iVar4) {
      case 0x61:
        local_98._32_8_ = local_98._32_8_ ^ 0x100000000;
        goto LAB_00358188;
      case 0x62:
        local_98._24_8_ = local_98._24_8_ ^ 0x100000000;
        goto LAB_00358188;
      case 99:
        local_98.fGiaSimple = local_98.fGiaSimple ^ 1;
        goto LAB_00358188;
      case 100:
        local_98._40_8_ = local_98._40_8_ ^ 0x100000000;
        goto LAB_00358188;
      case 0x65:
        local_98._48_8_ = local_98._48_8_ ^ 1;
        goto LAB_00358188;
      case 0x66:
      case 0x67:
      case 0x68:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x70:
      case 0x72:
      case 0x75:
      case 0x77:
      case 0x78:
      case 0x79:
        goto switchD_003581a9_caseD_66;
      case 0x69:
        bVar2 = (bool)(bVar2 ^ 1);
        goto LAB_00358188;
      case 0x6d:
        local_98._24_8_ = local_98._24_8_ ^ 1;
        goto LAB_00358188;
      case 0x6e:
        local_50 = (ulong)((uint)local_50 ^ 1);
        goto LAB_00358188;
      case 0x6f:
        local_98.fAddOutputs = local_98.fAddOutputs ^ 1;
        goto LAB_00358188;
      case 0x71:
        local_98._32_8_ = local_98._32_8_ ^ 1;
        goto LAB_00358188;
      case 0x73:
        local_98._48_8_ = local_98._48_8_ ^ 0x100000000;
        goto LAB_00358188;
      case 0x74:
        local_98._40_8_ = local_98._40_8_ ^ 0x100000000;
        bVar1 = (bool)(bVar1 ^ 1);
        goto LAB_00358188;
      case 0x76:
        local_98._56_8_ = local_98._56_8_ ^ 0x100000000;
        goto LAB_00358188;
      case 0x7a:
        local_98._56_8_ = local_98._56_8_ ^ 1;
        goto LAB_00358188;
      default:
        if (iVar4 == 0x52) {
          if (argc <= globalUtilOptind) {
            pcVar8 = "Command line switch \"-R\" should be followed by an integer.\n";
            goto LAB_0035832e;
          }
          uVar5 = atoi(argv[globalUtilOptind]);
          local_98.nOutputRange = uVar5;
        }
        else {
          if (iVar4 != 0x4f) goto switchD_003581a9_caseD_66;
          if (argc <= globalUtilOptind) {
            pcVar8 = "Command line switch \"-O\" should be followed by an integer.\n";
LAB_0035832e:
            Abc_Print(-1,pcVar8);
            goto switchD_003581a9_caseD_66;
          }
          uVar5 = atoi(argv[globalUtilOptind]);
          local_98.iOutput = uVar5;
        }
      }
    }
LAB_003582d0:
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar5 < 0) {
switchD_003581a9_caseD_66:
      Abc_Print(-2,"usage: %%blast [-ORAM num] [-combqadestnizvh]\n");
      Abc_Print(-2,"\t         performs bit-blasting of the word-level design\n");
      Abc_Print(-2,
                "\t-O num : zero-based index of the first word-level PO to bit-blast [default = %d]\n"
                ,(ulong)(uint)local_98.iOutput);
      Abc_Print(-2,"\t-R num : the total number of word-level POs to bit-blast [default = %d]\n",
                (ulong)(uint)local_98.nOutputRange);
      Abc_Print(-2,"\t-A num : blast adders smaller than this (0 = unused) [default = %d]\n",
                (ulong)(uint)local_98.nAdderLimit);
      Abc_Print(-2,"\t-M num : blast multipliers smaller than this (0 = unused) [default = %d]\n",
                (ulong)(uint)local_98.nMultLimit);
      pcVar9 = "yes";
      pcVar8 = "yes";
      if (local_98.fGiaSimple == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,
                "\t-c     : toggle using AIG w/o const propagation and strashing [default = %s]\n",
                pcVar8);
      pcVar8 = "yes";
      if (local_98.fAddOutputs == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,
                "\t-o     : toggle using additional POs on the word-level boundaries [default = %s]\n"
                ,pcVar8);
      pcVar8 = "yes";
      if (local_98.fMulti == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,
                "\t-m     : toggle creating boxes for all multipliers in the design [default = %s]\n"
                ,pcVar8);
      pcVar8 = "yes";
      if (local_98.fBooth == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-b     : toggle generating radix-4 Booth multipliers [default = %s]\n",pcVar8)
      ;
      pcVar8 = "yes";
      if (local_98.fNonRest == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-q     : toggle generating non-restoring square root [default = %s]\n",pcVar8)
      ;
      pcVar8 = "yes";
      if (local_98.fCla == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle generating carry-look-ahead adder [default = %s]\n",pcVar8);
      pcVar8 = "yes";
      if (local_98.fCreateMiter == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle creating dual-output multi-output miter [default = %s]\n",
                pcVar8);
      pcVar8 = "yes";
      if (local_98.fCreateWordMiter == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,
                "\t-e     : toggle creating miter with output word bits combined [default = %s]\n",
                pcVar8);
      pcVar8 = "yes";
      if (local_98.fDecMuxes == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle creating decoded MUXes [default = %s]\n",pcVar8);
      pcVar8 = "yes";
      if (!bVar1) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle creating regular multi-output miter [default = %s]\n",pcVar8);
      pcVar8 = "yes";
      if ((int)local_50 == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-n     : toggle dumping signal names into a text file [default = %s]\n",pcVar8
               );
      pcVar8 = "yes";
      if (!bVar2) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-i     : toggle to print input names after blasting [default = %s]\n",pcVar8);
      pcVar8 = "yes";
      if (local_98.fSaveFfNames == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-z     : toggle saving flop names after blasting [default = %s]\n",pcVar8);
      if (local_98.fVerbose == 0) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar9);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandBlast( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Wlc_NtkPrintInputInfo( Wlc_Ntk_t * pNtk );
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    Gia_Man_t * pNew = NULL; int c, fMiter = 0, fDumpNames = 0, fPrintInputInfo = 0;
    Wlc_BstPar_t Par, * pPar = &Par;
    Wlc_BstParDefault( pPar );
    pPar->nOutputRange = 2;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ORAMcombqadestnizvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            pPar->iOutput = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPar->iOutput < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPar->nOutputRange = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPar->nOutputRange < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            pPar->nAdderLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPar->nAdderLimit < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPar->nMultLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPar->nMultLimit < 0 )
                goto usage;
            break;
        case 'c':
            pPar->fGiaSimple ^= 1;
            break;
        case 'o':
            pPar->fAddOutputs ^= 1;
            break;
        case 'm':
            pPar->fMulti ^= 1;
            break;
        case 'b':
            pPar->fBooth ^= 1;
            break;
        case 'q':
            pPar->fNonRest ^= 1;
            break;
        case 'a':
            pPar->fCla ^= 1;
            break;
        case 'd':
            pPar->fCreateMiter ^= 1;
            break;
        case 'e':
            pPar->fCreateWordMiter ^= 1;
            break;
        case 's':
            pPar->fDecMuxes ^= 1;
            break;
        case 't':
            pPar->fCreateMiter ^= 1;
            fMiter ^= 1;
            break;
        case 'n':
            fDumpNames ^= 1;
            break;
        case 'i': 
            fPrintInputInfo ^= 1; 
            break;
        case 'z': 
            pPar->fSaveFfNames ^= 1; 
            break;
        case 'v':
            pPar->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandBlast(): There is no current design.\n" );
        return 0;
    }
    if ( pNtk->fAsyncRst )
    {
        Abc_Print( 1, "Abc_CommandBlast(): Trying to bit-blast network with asynchronous reset.\n" );
        return 0;
    }
    if ( fPrintInputInfo )
        Wlc_NtkPrintInputInfo(pNtk); 
    if ( pPar->fMulti )
    {
        pPar->vBoxIds = Wlc_NtkCollectMultipliers( pNtk );
        if ( pPar->vBoxIds == NULL )
            Abc_Print( 1, "Warning:  There is no multipliers in the design.\n" );
    }
    else if ( pPar->nAdderLimit || pPar->nMultLimit )
    {
        int CountA, CountM;
        pPar->vBoxIds = Wlc_NtkCollectAddMult( pNtk, pPar, &CountA, &CountM );
        if ( pPar->vBoxIds == NULL )
            Abc_Print( 1, "Warning:  There is no adders and multipliers that will not be blasted.\n" );
        else 
            Abc_Print( 1, "Warning:  %d adders and %d multipliers will not be blasted.\n", CountA, CountM );
    }
    if ( pPar->iOutput >= 0 && pPar->iOutput + pPar->nOutputRange > Wlc_NtkPoNum(pNtk) )
    {
        Abc_Print( 1, "Abc_CommandBlast(): The output range [%d:%d] is incorrect.\n", pPar->iOutput, pPar->iOutput + pPar->nOutputRange - 1 );
        return 0;
    }
    // transform
    pNew = Wlc_NtkBitBlast( pNtk, pPar );
    Vec_IntFreeP( &pPar->vBoxIds );
    if ( pNew == NULL )
    {
        Abc_Print( 1, "Abc_CommandBlast(): Bit-blasting has failed.\n" );
        return 0;
    }
    // generate miter
    if ( fMiter )
    {
        Gia_Man_t * pTemp = pNew;
        pNew = Gia_ManTransformMiter( pNew );
        Gia_ManStop( pTemp );
        Abc_Print( 1, "Bit-blasting created a traditional multi-output miter by XORing POs pair-wise.\n" );
        if ( fDumpNames )
        {
            int i; char * pName;
            FILE * pFile = fopen( "pio_name_map.txt", "wb" );
            if ( pNew->vNamesIn )
                Vec_PtrForEachEntry( char *, pNew->vNamesIn, pName, i )
                    fprintf( pFile, "i%d %s\n", i, pName );
            if ( pNew->vNamesOut )
                Vec_PtrForEachEntry( char *, pNew->vNamesOut, pName, i )
                    fprintf( pFile, "o%d %s\n", i, pName );
            fclose( pFile );
            Abc_Print( 1, "Finished dumping file \"pio_name_map.txt\" containing PI/PO name mapping.\n" );
        }
    }
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;
usage:
    Abc_Print( -2, "usage: %%blast [-ORAM num] [-combqadestnizvh]\n" );
    Abc_Print( -2, "\t         performs bit-blasting of the word-level design\n" );
    Abc_Print( -2, "\t-O num : zero-based index of the first word-level PO to bit-blast [default = %d]\n", pPar->iOutput );
    Abc_Print( -2, "\t-R num : the total number of word-level POs to bit-blast [default = %d]\n",          pPar->nOutputRange );
    Abc_Print( -2, "\t-A num : blast adders smaller than this (0 = unused) [default = %d]\n",              pPar->nAdderLimit );
    Abc_Print( -2, "\t-M num : blast multipliers smaller than this (0 = unused) [default = %d]\n",         pPar->nMultLimit );
    Abc_Print( -2, "\t-c     : toggle using AIG w/o const propagation and strashing [default = %s]\n",     pPar->fGiaSimple? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggle using additional POs on the word-level boundaries [default = %s]\n", pPar->fAddOutputs? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle creating boxes for all multipliers in the design [default = %s]\n",  pPar->fMulti? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle generating radix-4 Booth multipliers [default = %s]\n",              pPar->fBooth? "yes": "no" );
    Abc_Print( -2, "\t-q     : toggle generating non-restoring square root [default = %s]\n",              pPar->fNonRest? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle generating carry-look-ahead adder [default = %s]\n",                 pPar->fCla? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle creating dual-output multi-output miter [default = %s]\n",           pPar->fCreateMiter? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle creating miter with output word bits combined [default = %s]\n",     pPar->fCreateWordMiter? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle creating decoded MUXes [default = %s]\n",                            pPar->fDecMuxes? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle creating regular multi-output miter [default = %s]\n",               fMiter? "yes": "no" );
    Abc_Print( -2, "\t-n     : toggle dumping signal names into a text file [default = %s]\n",             fDumpNames? "yes": "no" );
    Abc_Print( -2, "\t-i     : toggle to print input names after blasting [default = %s]\n",               fPrintInputInfo ? "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle saving flop names after blasting [default = %s]\n",                  pPar->fSaveFfNames ? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",                      pPar->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}